

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetDeviceGetDebugProperties
          (zet_device_handle_t hDevice,zet_device_debug_properties_t *pDebugProperties)

{
  zet_pfnDeviceGetDebugProperties_t pfnGetDebugProperties;
  ze_result_t result;
  zet_device_debug_properties_t *pDebugProperties_local;
  zet_device_handle_t hDevice_local;
  
  pfnGetDebugProperties._4_4_ = ZE_RESULT_SUCCESS;
  if (_DAT_0011c7f8 != (code *)0x0) {
    pfnGetDebugProperties._4_4_ = (*_DAT_0011c7f8)(hDevice,pDebugProperties);
  }
  return pfnGetDebugProperties._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDeviceGetDebugProperties(
        zet_device_handle_t hDevice,                    ///< [in] device handle
        zet_device_debug_properties_t* pDebugProperties ///< [in,out] query result for debug properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetDebugProperties = context.zetDdiTable.Device.pfnGetDebugProperties;
        if( nullptr != pfnGetDebugProperties )
        {
            result = pfnGetDebugProperties( hDevice, pDebugProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }